

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_v_predictor_16x32_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  
  iVar4 = 0x20;
  do {
    uVar1 = *(undefined8 *)above;
    uVar2 = *(undefined8 *)(above + 4);
    uVar3 = *(undefined8 *)(above + 0xc);
    *(undefined8 *)(dst + 8) = *(undefined8 *)(above + 8);
    *(undefined8 *)(dst + 0xc) = uVar3;
    *(undefined8 *)dst = uVar1;
    *(undefined8 *)(dst + 4) = uVar2;
    dst = dst + stride;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

static inline void highbd_v_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int bd) {
  int r;
  (void)left;
  (void)bd;
  for (r = 0; r < bh; r++) {
    memcpy(dst, above, bw * sizeof(uint16_t));
    dst += stride;
  }
}